

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charpoly.h
# Opt level: O0

void charpoly_danilevsky_piv<Eigen::Matrix<double,11,11,0,11,11>>
               (MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *A,double *p)

{
  int iVar1;
  Index IVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  double *pdVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,_11,_11,_0,_11,_11>,_0>
  PVar6;
  int local_36c;
  undefined1 local_368 [4];
  int i_1;
  ConstantReturnType local_338;
  RowXpr local_320;
  non_const_type local_2f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_2e8;
  RowXpr local_2b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_288;
  int local_21c;
  undefined1 local_218 [4];
  int j_1;
  undefined1 local_1e8 [8];
  VectorXd Acol;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1d0;
  undefined1 local_1a0 [8];
  VectorXd vinv;
  non_const_type local_150;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,_11,_11,_0,_11,_11>,_0>
  local_148;
  EigenBase<Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>_> local_138 [48];
  undefined1 local_108 [8];
  VectorXd v;
  ColXpr local_c8;
  RowXpr local_98;
  RowXpr local_68;
  int local_34;
  Scalar SStack_30;
  int j;
  double piv;
  int local_20;
  int piv_ind;
  int i;
  int n;
  double *p_local;
  MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *A_local;
  
  _i = p;
  p_local = (double *)A;
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::rows
                    ((EigenBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)A);
  piv_ind = (int)IVar2;
  iVar1 = piv_ind;
  while (local_20 = iVar1 + -1, 0 < local_20) {
    piv._4_4_ = iVar1 + -2;
    pdVar5 = p_local;
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
              ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)p_local,
               (long)local_20,(long)(iVar1 + -2));
    std::abs((int)pdVar5);
    SStack_30 = extraout_XMM0_Qa;
    for (local_34 = 0; local_34 < local_20 + -1; local_34 = local_34 + 1) {
      pdVar5 = p_local;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)p_local,
                 (long)local_20,(long)local_34);
      std::abs((int)pdVar5);
      if (SStack_30 < extraout_XMM0_Qa_00) {
        pdVar5 = p_local;
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)p_local,
                   (long)local_20,(long)local_34);
        std::abs((int)pdVar5);
        piv._4_4_ = local_34;
        SStack_30 = extraout_XMM0_Qa_01;
      }
    }
    if (piv._4_4_ != local_20 + -1) {
      Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::row
                (&local_68,(DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local,
                 (long)(local_20 + -1));
      Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::row
                (&local_98,(DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local,
                 (long)piv._4_4_);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>>::
      swap<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>>
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>> *)
                 &local_68,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>_> *
                 )&local_98);
      Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::col
                (&local_c8,(DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local,
                 (long)(local_20 + -1));
      Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::col
                ((ColXpr *)
                 &v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 (DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local,(long)piv._4_4_);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,11,1,true>>::
      swap<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,11,1,true>>
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,11,1,true>> *)&local_c8
                 ,(DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true>_> *
                  )&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
    }
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)p_local,
                        (long)local_20,(long)(local_20 + -1));
    SStack_30 = *pSVar3;
    Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::row
              ((RowXpr *)local_138,(DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local,
               (long)local_20);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>>
              ((Matrix<double,_1,1,0,_1,1> *)local_108,local_138);
    local_150 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_108);
    PVar6 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
                      ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_150
                       ,(MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local);
    local_148 = PVar6;
    Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::row
              ((RowXpr *)
               &vinv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               ,(DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local,
               (long)(local_20 + -1));
    Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>::operator=
              ((Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false> *)
               &vinv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               ,(DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,_11,_11,_0,_11,_11>,_0>_>
                 *)&local_148);
    Acol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         -0x4010000000000000;
    Eigen::operator*(&local_1d0,
                     (double *)
                     &Acol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows,(StorageBaseType *)local_108);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,_1,1,0,_1,1> *)local_1a0,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_1d0);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1a0,
                        (long)(local_20 + -1));
    *pSVar4 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a0,
               &stack0xffffffffffffffd0);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1a0,
                        (long)(local_20 + -1));
    *pSVar4 = *pSVar4 + -1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::col
              ((ColXpr *)local_218,(DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local,
               (long)(local_20 + -1));
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,11,1,true>>
              ((Matrix<double,_1,1,0,_1,1> *)local_1e8,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true>_> *)
               local_218);
    for (local_21c = 0; local_21c <= local_20; local_21c = local_21c + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::row
                (&local_2b8,(DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local,
                 (long)local_21c);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1e8,
                          (long)local_21c);
      local_2f0 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a0);
      Eigen::operator*(&local_2e8,pSVar4,(StorageBaseType *)&local_2f0);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>>::operator+
                (&local_288,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>> *)
                 &local_2b8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_2e8);
      Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::row
                (&local_320,(DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local,
                 (long)local_21c);
      Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>::operator=
                ((Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false> *)&local_320,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                  *)&local_288);
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_338,(long)piv_ind);
    Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::row
              ((RowXpr *)local_368,(DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)p_local,
               (long)local_20);
    Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>::operator=
              ((Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false> *)local_368,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_338);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)p_local,
                        (long)local_20,(long)(local_20 + -1));
    *pSVar3 = 1.0;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_1e8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_1a0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_108);
    iVar1 = local_20;
  }
  _i[piv_ind] = 1.0;
  for (local_36c = 0; local_36c < piv_ind; local_36c = local_36c + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)p_local,0,
                        (long)((piv_ind - local_36c) + -1));
    _i[local_36c] = -*pSVar3;
  }
  return;
}

Assistant:

void charpoly_danilevsky_piv(Eigen::MatrixBase<Derived> &A, double *p) {
	int n = A.rows();

	for (int i = n - 1; i > 0; i--) {

		int piv_ind = i - 1;
		double piv = std::abs(A(i, i - 1));

		// Find largest pivot
		for (int j = 0; j < i - 1; j++) {
			if (std::abs(A(i, j)) > piv) {
				piv = std::abs(A(i, j));
				piv_ind = j;
			}
		}
		if (piv_ind != i - 1) {
			// Perform permutation
			A.row(i - 1).swap(A.row(piv_ind));
			A.col(i - 1).swap(A.col(piv_ind));
		}
		piv = A(i, i - 1);

		Eigen::VectorXd v = A.row(i);
		A.row(i - 1) = v.transpose()*A;

		Eigen::VectorXd vinv = (-1.0)*v;
		vinv(i - 1) = 1;
		vinv /= piv;
		vinv(i - 1) -= 1;
		Eigen::VectorXd Acol = A.col(i - 1);
		for (int j = 0; j <= i; j++)
			A.row(j) = A.row(j) + Acol(j)*vinv.transpose();


		A.row(i) = Eigen::VectorXd::Zero(n);
		A(i, i - 1) = 1;
	}
	p[n] = 1;
	for (int i = 0; i < n; i++)
		p[i] = -A(0, n - i - 1);
}